

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_group_norm_impl(ggml_context *ctx,ggml_tensor *a,int n_groups,float eps,_Bool inplace)

{
  ggml_tensor *tensor;
  byte in_CL;
  int32_t in_EDX;
  ggml_tensor *in_RSI;
  float in_XMM0_Da;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  if ((in_CL & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    tensor = ggml_view_tensor((ggml_context *)
                              (CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
                              in_stack_ffffffffffffffd8);
  }
  ggml_set_op_params_i32(tensor,0,in_EDX);
  ggml_set_op_params_f32(tensor,1,in_XMM0_Da);
  tensor->op = GGML_OP_GROUP_NORM;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_group_norm_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_groups,
        float                 eps,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params_i32(result, 0, n_groups);
    ggml_set_op_params_f32(result, 1, eps);

    result->op     = GGML_OP_GROUP_NORM;
    result->src[0] = a;

    return result;
}